

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O1

Offset wabt::WriteU32Leb128Raw(uint8_t *dest,uint8_t *dest_end,uint32_t value)

{
  bool bVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  size_t __n;
  uint8_t data [5];
  byte local_d [5];
  
  uVar2 = (ulong)value;
  __n = 0;
  do {
    uVar4 = __n;
    uVar2 = uVar2 >> 7;
    bVar3 = (byte)value | 0x80;
    if (value < 0x80) {
      bVar3 = (byte)value;
    }
    local_d[uVar4] = bVar3;
    __n = uVar4 + 1;
    bVar1 = 0x7f < value;
    value = (uint)uVar2;
  } while (bVar1);
  if (uVar4 < (ulong)((long)dest_end - (long)dest)) {
    memcpy(dest,local_d,__n);
  }
  else {
    __n = 0;
  }
  return __n;
}

Assistant:

Offset WriteU32Leb128Raw(uint8_t* dest, uint8_t* dest_end, uint32_t value) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length = 0;
  LEB128_LOOP_UNTIL(value == 0);
  if (static_cast<Offset>(dest_end - dest) < length) {
    return 0;
  }
  memcpy(dest, data, length);
  return length;
}